

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O2

bool __thiscall
Parameter<bool>::internalSetData<std::__cxx11::string>
          (Parameter<bool> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  bool bVar1;
  bool tmp;
  RepType local_41;
  string local_40;
  
  local_41 = false;
  std::__cxx11::string::string((string *)&local_40,(string *)data);
  bVar1 = ParameterTraits<bool>::convert(&local_40,&local_41);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    (this->super_ParameterBase).empty_ = false;
    (this->super_ParameterBase).field_0x2b = local_41;
  }
  return bVar1;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }